

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithreading.c
# Opt level: O1

void * sample_scene_slave(void *data)

{
  ImageBuffer *buffer;
  Ray r_00;
  long lVar1;
  long lVar2;
  Color c;
  float dy;
  float dx;
  Ray r;
  int local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  long local_58;
  Sampler *local_50;
  Ray local_48;
  
  local_70 = *(int *)((long)data + 8);
  if (local_70 < *(int *)((long)data + 0xc)) {
    do {
      lVar2 = (long)*data;
      if (*data < *(int *)((long)data + 4)) {
        local_64 = (float)local_70;
        local_58 = (long)local_70;
        do {
          lVar1 = (**(int **)((long)data + 0x10) * local_58 + lVar2) * 0x68;
          local_50 = (Sampler *)(*(long *)((long)data + 0x88) + lVar1);
          *(undefined8 *)(*(long *)((long)data + 0x88) + 0x30 + lVar1) = 0;
          sample_unit_square(local_50,&local_68,&local_6c,(float *)0x0);
          camera_ray(&local_48,*(Camera *)((long)data + 0x48),
                     ((float)(int)lVar2 + local_68) / (float)**(int **)((long)data + 0x10),
                     1.0 - (local_6c + local_64) / (float)(*(int **)((long)data + 0x10))[1]);
          pthread_mutex_lock((pthread_mutex_t *)((long)data + 0x18));
          local_5c = local_68;
          local_60 = local_6c;
          buffer = *(ImageBuffer **)((long)data + 0x10);
          r_00.o.z = local_48.o.z;
          r_00.d.x = local_48.d.x;
          r_00.o.x = local_48.o.x;
          r_00.o.y = local_48.o.y;
          r_00.d.y = local_48.d.y;
          r_00.d.z = local_48.d.z;
          c = trace_ray(*(Scene **)((long)data + 0x40),r_00,0,local_50);
          add_pixel_sample(buffer,(int)lVar2,(int)local_58,local_5c,local_60,c);
          pthread_mutex_unlock((pthread_mutex_t *)((long)data + 0x18));
          lVar2 = lVar2 + 1;
        } while ((int)lVar2 < *(int *)((long)data + 4));
      }
      local_70 = local_70 + 1;
    } while (local_70 < *(int *)((long)data + 0xc));
  }
  return (void *)0x0;
}

Assistant:

void* sample_scene_slave(void* data) {
    SceneSampleInfo* ss = (SceneSampleInfo*) data;

    for (int y = ss->ymin; y < ss->ymax; y++) {
        for (int x = ss->xmin; x < ss->xmax; x++) {
            Sampler* sampler = &ss->samplers[y * ss->buffer->width + x];
            sampler->current_depth = 0;
            float dx, dy;
            sample_unit_square(sampler, &dx, &dy, NULL);
            float sx = (x + dx) / ss->buffer->width;
            float sy = 1.0f - (y + dy) / ss->buffer->height;
            Ray r = camera_ray(ss->camera, sx, sy);

            pthread_mutex_lock(&ss->buffer_mutex);
            add_pixel_sample(ss->buffer, x, y, dx, dy,
                             trace_ray(ss->scene, r, 0, sampler));
            pthread_mutex_unlock(&ss->buffer_mutex);
        }
    }

    return NULL;
}